

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O3

void __thiscall audiofft::OouraFFT::fft(OouraFFT *this,float *data,float *re,float *im)

{
  size_t sVar1;
  double *pdVar2;
  pointer pdVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  sVar1 = this->_size;
  pdVar2 = (this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar1 != 0) {
    sVar5 = 0;
    do {
      pdVar2[sVar5] = (double)data[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  rdft(this,(int)sVar1,1,pdVar2,
       (this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start,(this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start);
  sVar1 = this->_size;
  if (sVar1 != 0) {
    pdVar3 = (this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pdVar2 = (double *)((long)pdVar3 + lVar6 * 4);
      *(float *)((long)re + lVar6) = (float)*pdVar2;
      *(float *)((long)im + lVar6) = -(float)pdVar2[1];
      lVar6 = lVar6 + 4;
    } while (pdVar2 + 2 != pdVar3 + sVar1);
  }
  uVar4 = sVar1 * 2 & 0xfffffffffffffffc;
  *(float *)((long)re + uVar4) = -*im;
  *im = 0.0;
  *(undefined4 *)((long)im + uVar4) = 0;
  return;
}

Assistant:

virtual void fft(const float* data, float* re, float* im) override
        {
          // Convert into the format as required by the Ooura FFT
          detail::ConvertBuffer(_buffer.data(), data, _size);

          rdft(static_cast<int>(_size), +1, _buffer.data(), _ip.data(), _w.data());

          // Convert back to split-complex
          {
            double* b = _buffer.data();
            double* bEnd = b + _size;
            float *r = re;
            float *i = im;
            while (b != bEnd)
            {
              *(r++) = static_cast<float>(*(b++));
              *(i++) = static_cast<float>(-(*(b++)));
            }
          }
          const size_t size2 = _size / 2;
          re[size2] = -im[0];
          im[0] = 0.0;
          im[size2] = 0.0;
        }